

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManComputeOverlap(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int Id;
  
  if (p->vMapping != (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManAndNum(p);
    iVar1 = -iVar1;
    for (Id = 1; Id < p->nObjs; Id = Id + 1) {
      iVar2 = Gia_ObjIsLut(p,Id);
      if (iVar2 != 0) {
        iVar2 = Gia_ManComputeOverlapOne(p,Id);
        iVar1 = iVar1 + iVar2;
      }
    }
    return iVar1;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x176,"int Gia_ManComputeOverlap(Gia_Man_t *)");
}

Assistant:

int Gia_ManComputeOverlap( Gia_Man_t * p )
{
    int i, Count = -Gia_ManAndNum(p);
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, i )
        Count += Gia_ManComputeOverlapOne( p, i );
    return Count;
}